

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_t.cpp
# Opt level: O2

void __thiscall
deci::ast_binary_t::ast_binary_t(ast_binary_t *this,string *identifier,ast_item_t *a,ast_item_t *b)

{
  (this->super_ast_item_t).parent = (ast_item_t *)0x0;
  (this->super_ast_item_t)._vptr_ast_item_t = (_func_int **)&PTR_EndLocationTag_abi_cxx11__0011d528;
  std::__cxx11::string::string((string *)&this->identifier,(string *)identifier);
  this->a = a;
  this->b = b;
  return;
}

Assistant:

ast_binary_t::ast_binary_t(const std::string& identifier, ast_item_t* a, ast_item_t* b)
    :identifier(identifier),a(a),b(b) {
      ;
  }